

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O3

void duckdb::TupleDataCollection::ComputeHeapSizes
               (Vector *heap_sizes_v,Vector *source_v,TupleDataVectorFormat *source_format,
               SelectionVector *append_sel,idx_t append_count)

{
  PhysicalType PVar1;
  uint uVar2;
  data_ptr_t pdVar3;
  SelectionVector *pSVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  data_ptr_t pdVar8;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  const_reference this_00;
  reference pvVar9;
  type source_v_00;
  Vector *source_v_01;
  NotImplementedException *this_01;
  size_type __n;
  idx_t iVar10;
  idx_t iVar11;
  string local_70;
  string local_50;
  
  PVar1 = (source_v->type).physical_type_;
  if (((PVar1 < 0x1e) && ((0x21800000U >> (PVar1 & 0x1f) & 1) != 0)) || (PVar1 == VARCHAR)) {
    pdVar3 = heap_sizes_v->data;
    pSVar4 = (source_format->unified).sel;
    if (PVar1 < ARRAY) {
      if (PVar1 == LIST) {
        if (append_count != 0) {
          psVar5 = append_sel->sel_vector;
          psVar6 = pSVar4->sel_vector;
          puVar7 = (source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
                   validity_mask;
          iVar10 = 0;
          do {
            iVar11 = iVar10;
            if (psVar5 != (sel_t *)0x0) {
              iVar11 = (idx_t)psVar5[iVar10];
            }
            if (psVar6 != (sel_t *)0x0) {
              iVar11 = (idx_t)psVar6[iVar11];
            }
            if ((puVar7 == (unsigned_long *)0x0) ||
               ((puVar7[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) != 0)) {
              *(long *)(pdVar3 + iVar10 * 8) = *(long *)(pdVar3 + iVar10 * 8) + 8;
            }
            iVar10 = iVar10 + 1;
          } while (append_count != iVar10);
        }
        source_v_01 = ListVector::GetEntry(source_v);
LAB_012daba1:
        pvVar9 = vector<duckdb::TupleDataVectorFormat,_true>::operator[](&source_format->children,0)
        ;
        WithinCollectionComputeHeapSizes
                  (heap_sizes_v,source_v_01,pvVar9,append_sel,append_count,&source_format->unified);
        return;
      }
      if (PVar1 != STRUCT) {
LAB_012dac4b:
        this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"ComputeHeapSizes for %s","");
        EnumUtil::ToString<duckdb::LogicalTypeId>(&local_50,(source_v->type).id_);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this_01,&local_70,&local_50);
        __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      this = StructVector::GetEntries(source_v);
      if ((this->
          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->
          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        __n = 0;
        do {
          this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::operator[](this,__n);
          pvVar9 = vector<duckdb::TupleDataVectorFormat,_true>::operator[]
                             (&source_format->children,__n);
          source_v_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(this_00);
          ComputeHeapSizes(heap_sizes_v,source_v_00,pvVar9,append_sel,append_count);
          __n = __n + 1;
        } while (__n < (ulong)((long)(this->
                                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->
                                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
    }
    else {
      if (PVar1 != VARCHAR) {
        if (PVar1 != ARRAY) goto LAB_012dac4b;
        if (append_count != 0) {
          psVar5 = append_sel->sel_vector;
          psVar6 = pSVar4->sel_vector;
          puVar7 = (source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
                   validity_mask;
          iVar10 = 0;
          do {
            iVar11 = iVar10;
            if (psVar5 != (sel_t *)0x0) {
              iVar11 = (idx_t)psVar5[iVar10];
            }
            if (psVar6 != (sel_t *)0x0) {
              iVar11 = (idx_t)psVar6[iVar11];
            }
            if ((puVar7 == (unsigned_long *)0x0) ||
               ((puVar7[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) != 0)) {
              *(long *)(pdVar3 + iVar10 * 8) = *(long *)(pdVar3 + iVar10 * 8) + 8;
            }
            iVar10 = iVar10 + 1;
          } while (append_count != iVar10);
        }
        source_v_01 = ArrayVector::GetEntry(source_v);
        goto LAB_012daba1;
      }
      if (append_count != 0) {
        pdVar8 = (source_format->unified).data;
        psVar5 = append_sel->sel_vector;
        psVar6 = pSVar4->sel_vector;
        puVar7 = (source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
                 validity_mask;
        iVar10 = 0;
        do {
          iVar11 = iVar10;
          if (psVar5 != (sel_t *)0x0) {
            iVar11 = (idx_t)psVar5[iVar10];
          }
          if (psVar6 != (sel_t *)0x0) {
            iVar11 = (idx_t)psVar6[iVar11];
          }
          if ((puVar7 == (unsigned_long *)0x0) ||
             ((puVar7[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) != 0)) {
            uVar2 = *(uint *)(pdVar8 + iVar11 * 0x10);
            if (uVar2 < 0xd) {
              uVar2 = 0;
            }
            *(ulong *)(pdVar3 + iVar10 * 8) = *(long *)(pdVar3 + iVar10 * 8) + (ulong)uVar2;
          }
          iVar10 = iVar10 + 1;
        } while (append_count != iVar10);
      }
    }
  }
  return;
}

Assistant:

void TupleDataCollection::ComputeHeapSizes(Vector &heap_sizes_v, const Vector &source_v,
                                           TupleDataVectorFormat &source_format, const SelectionVector &append_sel,
                                           const idx_t append_count) {
	const auto type = source_v.GetType().InternalType();
	if (type != PhysicalType::VARCHAR && type != PhysicalType::STRUCT && type != PhysicalType::LIST &&
	    type != PhysicalType::ARRAY) {
		return;
	}

	auto heap_sizes = FlatVector::GetData<idx_t>(heap_sizes_v);

	// Source
	const auto &source_vector_data = source_format.unified;
	const auto &source_sel = *source_vector_data.sel;
	const auto &source_validity = source_vector_data.validity;

	switch (type) {
	case PhysicalType::VARCHAR: {
		// Only non-inlined strings are stored in the heap
		const auto source_data = UnifiedVectorFormat::GetData<string_t>(source_vector_data);
		for (idx_t i = 0; i < append_count; i++) {
			const auto source_idx = source_sel.get_index(append_sel.get_index(i));
			if (source_validity.RowIsValid(source_idx)) {
				heap_sizes[i] += StringHeapSize(source_data[source_idx]);
			} else {
				heap_sizes[i] += StringHeapSize(NullValue<string_t>());
			}
		}
		break;
	}
	case PhysicalType::STRUCT: {
		// Recurse through the struct children
		auto &struct_sources = StructVector::GetEntries(source_v);
		for (idx_t struct_col_idx = 0; struct_col_idx < struct_sources.size(); struct_col_idx++) {
			const auto &struct_source = struct_sources[struct_col_idx];
			auto &struct_format = source_format.children[struct_col_idx];
			ComputeHeapSizes(heap_sizes_v, *struct_source, struct_format, append_sel, append_count);
		}
		break;
	}
	case PhysicalType::LIST: {
		// Lists are stored entirely in the heap
		for (idx_t i = 0; i < append_count; i++) {
			auto source_idx = source_sel.get_index(append_sel.get_index(i));
			if (source_validity.RowIsValid(source_idx)) {
				heap_sizes[i] += sizeof(uint64_t); // Size of the list
			}
		}

		// Recurse
		D_ASSERT(source_format.children.size() == 1);
		auto &child_source_v = ListVector::GetEntry(source_v);
		auto &child_format = source_format.children[0];
		WithinCollectionComputeHeapSizes(heap_sizes_v, child_source_v, child_format, append_sel, append_count,
		                                 source_vector_data);
		break;
	}
	case PhysicalType::ARRAY: {
		// Arrays are stored entirely in the heap
		for (idx_t i = 0; i < append_count; i++) {
			auto source_idx = source_sel.get_index(append_sel.get_index(i));
			if (source_validity.RowIsValid(source_idx)) {
				heap_sizes[i] += sizeof(uint64_t); // Size of the list
			}
		}

		// Recurse
		D_ASSERT(source_format.children.size() == 1);
		auto &child_source_v = ArrayVector::GetEntry(source_v);
		auto &child_format = source_format.children[0];
		WithinCollectionComputeHeapSizes(heap_sizes_v, child_source_v, child_format, append_sel, append_count,
		                                 source_vector_data);
		break;
	}
	default:
		throw NotImplementedException("ComputeHeapSizes for %s", EnumUtil::ToString(source_v.GetType().id()));
	}
}